

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AddLinkLibrary
          (cmTarget *this,cmMakefile *mf,string *lib,string *libRef,cmTargetLinkLibraryType llt)

{
  bool bVar1;
  __type _Var2;
  PolicyStatus PVar3;
  cmTarget *pcVar4;
  size_type sVar5;
  char *pcVar6;
  allocator<char> local_9d;
  cmTargetLinkLibraryType llt_local;
  string libName;
  string targetEntry;
  string local_50;
  
  llt_local = llt;
  pcVar4 = cmMakefile::FindTargetToUse(mf,lib,false);
  if (((pcVar4 == (cmTarget *)0x0) || (llt == GENERAL_LibraryType)) ||
     (pcVar4->IsImportedTarget != false)) {
    std::__cxx11::string::string((string *)&libName,(string *)libRef);
  }
  else {
    std::operator+(&targetEntry,"$<TARGET_NAME:",libRef);
    std::operator+(&libName,&targetEntry,">");
    std::__cxx11::string::~string((string *)&targetEntry);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&targetEntry,"LINK_LIBRARIES",&local_9d);
  GetDebugGeneratorExpressions(&local_50,this,&libName,llt);
  AppendProperty(this,&targetEntry,local_50._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&targetEntry);
  std::__cxx11::string::~string((string *)&libName);
  sVar5 = cmGeneratorExpression::Find(lib);
  if (((sVar5 == 0xffffffffffffffff) && (bVar1 = std::operator!=(lib,libRef), !bVar1)) &&
     ((pcVar4 == (cmTarget *)0x0 ||
      ((pcVar4->TargetTypeValue != OBJECT_LIBRARY && (pcVar4->TargetTypeValue != INTERFACE_LIBRARY))
      )))) {
    _Var2 = std::operator==(&this->Name,lib);
    if ((!_Var2) &&
       (std::
        vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
        ::emplace_back<std::__cxx11::string_const&,cmTargetLinkLibraryType&>
                  ((vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
                    *)&this->OriginalLinkLibraries,lib,&llt_local),
       this->TargetTypeValue - STATIC_LIBRARY < 3)) {
      PVar3 = GetPolicyStatusCMP0073(this);
      if ((PVar3 != OLD) && (PVar3 = GetPolicyStatusCMP0073(this), PVar3 != WARN)) {
        return;
      }
      std::__cxx11::string::string((string *)&targetEntry,(string *)&this->Name);
      std::__cxx11::string::append((char *)&targetEntry);
      libName._M_dataplus._M_p = (pointer)&libName.field_2;
      libName._M_string_length = 0;
      libName.field_2._M_local_buf[0] = '\0';
      pcVar6 = cmMakefile::GetDefinition(mf,&targetEntry);
      if (pcVar6 != (char *)0x0) {
        std::__cxx11::string::append((char *)&libName);
      }
      if (llt_local < (OPTIMIZED_LibraryType|DEBUG_LibraryType)) {
        std::__cxx11::string::append((char *)&libName);
      }
      std::__cxx11::string::append((char *)&libName);
      std::__cxx11::string::append((string *)&libName);
      std::__cxx11::string::append((char *)&libName);
      cmMakefile::AddCacheDefinition
                (mf,&targetEntry,libName._M_dataplus._M_p,"Dependencies for the target",STATIC,false
                );
      std::__cxx11::string::~string((string *)&libName);
      std::__cxx11::string::~string((string *)&targetEntry);
    }
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf, std::string const& lib,
                              std::string const& libRef,
                              cmTargetLinkLibraryType llt)
{
  cmTarget* tgt = mf.FindTargetToUse(lib);
  {
    const bool isNonImportedTarget = tgt && !tgt->IsImported();

    const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(libRef)
      : libRef;
    this->AppendProperty(
      "LINK_LIBRARIES",
      this->GetDebugGeneratorExpressions(libName, llt).c_str());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos || lib != libRef ||
      (tgt &&
       (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        tgt->GetType() == cmStateEnums::OBJECT_LIBRARY)) ||
      (this->Name == lib)) {
    return;
  }

  this->OriginalLinkLibraries.emplace_back(lib, llt);

  // Add the explicit dependency information for libraries. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if (this->TargetTypeValue >= cmStateEnums::STATIC_LIBRARY &&
      this->TargetTypeValue <= cmStateEnums::MODULE_LIBRARY &&
      (this->GetPolicyStatusCMP0073() == cmPolicies::OLD ||
       this->GetPolicyStatusCMP0073() == cmPolicies::WARN)) {
    std::string targetEntry = this->Name;
    targetEntry += "_LIB_DEPENDS";
    std::string dependencies;
    const char* old_val = mf.GetDefinition(targetEntry);
    if (old_val) {
      dependencies += old_val;
    }
    switch (llt) {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
    }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition(targetEntry, dependencies.c_str(),
                          "Dependencies for the target", cmStateEnums::STATIC);
  }
}